

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O0

void __thiscall asio::detail::thread_info_base::rethrow_pending_exception(thread_info_base *this)

{
  undefined8 uVar1;
  long in_RDI;
  exception_ptr ex;
  exception_ptr *in_stack_ffffffffffffffb8;
  exception_ptr *this_00;
  undefined1 local_18 [8];
  exception_ptr local_10 [2];
  
  if (0 < *(int *)(in_RDI + 0x50)) {
    *(undefined4 *)(in_RDI + 0x50) = 0;
    this_00 = local_10;
    std::__exception_ptr::exception_ptr::exception_ptr(this_00,(exception_ptr *)(in_RDI + 0x58));
    std::__exception_ptr::exception_ptr::exception_ptr(this_00,in_stack_ffffffffffffffb8);
    uVar1 = std::rethrow_exception((exception_ptr)local_18);
    std::__exception_ptr::exception_ptr::~exception_ptr(this_00);
    std::__exception_ptr::exception_ptr::~exception_ptr(this_00);
    _Unwind_Resume(uVar1);
  }
  return;
}

Assistant:

void rethrow_pending_exception()
  {
#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    if (has_pending_exception_ > 0)
    {
      has_pending_exception_ = 0;
      std::exception_ptr ex(
          ASIO_MOVE_CAST(std::exception_ptr)(
            pending_exception_));
      std::rethrow_exception(ex);
    }
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       // && !defined(ASIO_NO_EXCEPTIONS)
  }